

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChColor.cpp
# Opt level: O2

void __thiscall chrono::ChColor::ArchiveIN(ChColor *this,ChArchiveIn *marchive)

{
  ChNameValue<float> local_60;
  ChNameValue<float> local_48;
  ChNameValue<float> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChColor>(marchive);
  local_30._name = "R";
  local_30._flags = '\0';
  local_30._value = &this->R;
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->G;
  local_48._name = "G";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->B;
  local_60._name = "B";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChColor::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChColor>();

    // stream in all member data:
    marchive >> CHNVP(R);
    marchive >> CHNVP(G);
    marchive >> CHNVP(B);
}